

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JupiterAce.cpp
# Opt level: O2

bool IsValidDeepThoughtData(Data *data)

{
  pointer puVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uchar uVar6;
  
  iVar2 = GetDeepThoughtDataOffset(data);
  if (iVar2 != 0) {
    puVar1 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = (int)(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish - (int)puVar1;
    if (iVar2 != iVar4) {
      lVar5 = (long)(iVar4 + -1);
      uVar6 = '\0';
      for (lVar3 = (long)iVar2; lVar3 < lVar5; lVar3 = lVar3 + 1) {
        uVar6 = uVar6 + puVar1[lVar3];
      }
      return uVar6 == puVar1[lVar5];
    }
  }
  return false;
}

Assistant:

bool IsValidDeepThoughtData(const Data& data)
{
    auto offset = GetDeepThoughtDataOffset(data);
    if (!offset || offset == data.size())
        return false;

    uint8_t sum = 0;
    for (auto i = offset; i < data.size() - 1; ++i)
        sum += data[i];

    return sum == data[data.size() - 1];
}